

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Discoverer.cpp
# Opt level: O1

void __thiscall
new_words_discover::Discoverer::calculate_firmness
          (Discoverer *this,
          pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>
          *word)

{
  unsigned_long uVar1;
  size_t sVar2;
  mapped_type *pmVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  key_type local_78;
  mapped_type *local_58;
  double local_50;
  double local_48;
  double dStack_40;
  
  if ((word->first)._M_string_length == 0) {
    dVar6 = 1.79769313486232e+308;
  }
  else {
    uVar1 = (word->second).
            super__Tuple_impl<0UL,_unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>
            .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    dStack_40 = (double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25;
    local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    dVar6 = 1.79769313486232e+308;
    uVar5 = 0;
    do {
      uVar5 = uVar5 + 1;
      local_50 = dVar6;
      std::__cxx11::wstring::substr((ulong)&local_78,(ulong)word);
      local_58 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
      }
      std::__cxx11::wstring::substr((ulong)&local_78,(ulong)word);
      pmVar3 = std::__detail::
               _Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
      }
      sVar2 = this->tot_frequency_;
      auVar7._8_4_ = (int)(sVar2 >> 0x20);
      auVar7._0_8_ = sVar2;
      auVar7._12_4_ = 0x45300000;
      lVar4 = (pmVar3->
              super__Tuple_impl<0UL,_unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>
              ).super__Head_base<0UL,_unsigned_long,_false>._M_head_impl *
              (local_58->
              super__Tuple_impl<0UL,_unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>
              ).super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar8._0_8_ = lVar4;
      auVar8._12_4_ = 0x45300000;
      dVar6 = (((auVar7._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) * local_48) /
              ((auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
      if (local_50 <= dVar6) {
        dVar6 = local_50;
      }
    } while (uVar5 < (word->first)._M_string_length);
  }
  (word->second).
  super__Tuple_impl<0UL,_unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>
  .
  super__Tuple_impl<1UL,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>
  .
  super__Tuple_impl<2UL,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>
  .super__Tuple_impl<3UL,_double>.super__Head_base<3UL,_double,_false>._M_head_impl = dVar6;
  return;
}

Assistant:

void Discoverer::calculate_firmness(std::pair<const std::wstring, word_t> &word)
{
    size_t p_word = std::get<frequency_t>(word.second);
    double min_firmness = std::numeric_limits<double>::max();

    for (size_t i = 0; i < word.first.size(); ++i) {
        const auto &left_part = words_[word.first.substr(0, i + 1)];
        const auto &right_part = words_[word.first.substr(i + 1, word.first.size() - i - 1)];
        auto ans = static_cast<double>(p_word) * tot_frequency_ /
                   (std::get<frequency_t>(left_part) * std::get<frequency_t>(right_part));
        if (ans < min_firmness) {
            min_firmness = ans;
        }
    }
    std::get<firmness_t>(word.second) = min_firmness;
}